

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O1

int kvtree_write_with_lock(char *file,kvtree *hash)

{
  int fd;
  
  fd = kvtree_read_write_with_lock(file,hash,1);
  if (fd < 0) {
    kvtree_err("Failed to open file with lock %s @ %s:%d",file,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
               ,0x62f);
  }
  else {
    kvtree_write_fd(file,fd,hash);
    kvtree_close_with_unlock(file,fd);
  }
  return (uint)(fd < 0);
}

Assistant:

int kvtree_write_with_lock(const char* file, kvtree* hash)
{
  int fd = kvtree_read_write_with_lock(file, hash, 1);
  if (fd >= 0) {
    /* write the file into the hash */
    kvtree_write_fd(file, fd, hash);

    /* close the file and release the lock */
    kvtree_close_with_unlock(file, fd);

    return KVTREE_SUCCESS;
  } else {
    kvtree_err("Failed to open file with lock %s @ %s:%d",
      file, __FILE__, __LINE__
    );
  }

  return KVTREE_FAILURE;
}